

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Expression *
soul::ExpressionHelpers::forVariable
          (Expression *__return_storage_ptr__,VariableDeclaration *v,StringDictionary *dictionary)

{
  bool bVar1;
  uint uVar2;
  Expression *pEVar3;
  CallOrCast *pCVar4;
  pool_ptr<soul::AST::Expression> local_58;
  pool_ptr<soul::AST::CallOrCast> local_50;
  pool_ptr<soul::AST::CallOrCast> cc;
  Type local_38;
  StringDictionary *local_20;
  StringDictionary *dictionary_local;
  VariableDeclaration *v_local;
  
  local_20 = dictionary;
  dictionary_local = (StringDictionary *)v;
  v_local = (VariableDeclaration *)__return_storage_ptr__;
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&v->declaredType,(void *)0x0);
  if (bVar1) {
    pEVar3 = pool_ptr<soul::AST::Expression>::operator*
                       ((pool_ptr<soul::AST::Expression> *)&dictionary_local[1].strings);
    create(__return_storage_ptr__,pEVar3,local_20);
  }
  else {
    bVar1 = pool_ptr<soul::AST::Expression>::operator!=
                      ((pool_ptr<soul::AST::Expression> *)
                       &dictionary_local[1].strings.
                        super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(void *)0x0);
    checkAssertion(bVar1,"v.initialValue != nullptr","forVariable",0xb1);
    pEVar3 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)
                        &dictionary_local[1].strings.
                         super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    uVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if ((uVar2 & 1) == 0) {
      local_58.object =
           (Expression *)
           dictionary_local[1].strings.
           super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      cast<soul::AST::CallOrCast,soul::AST::Expression>((soul *)&local_50,&local_58);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_58);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_50);
      if (bVar1) {
        pCVar4 = pool_ptr<soul::AST::CallOrCast>::operator->(&local_50);
        pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pCVar4->nameOrType);
        create(__return_storage_ptr__,pEVar3,local_20);
      }
      pool_ptr<soul::AST::CallOrCast>::~pool_ptr(&local_50);
      if (!bVar1) {
        memset(__return_storage_ptr__,0,0x18);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::vector(&__return_storage_ptr__->sections);
      }
    }
    else {
      pEVar3 = pool_ptr<soul::AST::Expression>::operator->
                         ((pool_ptr<soul::AST::Expression> *)
                          &dictionary_local[1].strings.
                           super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])();
      create(__return_storage_ptr__,&local_38);
      Type::~Type(&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression forVariable (AST::VariableDeclaration& v, const StringDictionary& dictionary)
    {
        if (v.declaredType != nullptr)
            return create (*v.declaredType, dictionary);

        SOUL_ASSERT (v.initialValue != nullptr);

        if (v.initialValue->isResolved())
            return create (v.initialValue->getResultType());

        if (auto cc = cast<AST::CallOrCast> (v.initialValue))
            return create (cc->nameOrType, dictionary);

        return {};
    }